

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_astStatement *
new_for_statement(Context_conflict *ctx,MOJOSHADER_astVariableDeclaration *decl,
                 MOJOSHADER_astExpression *initializer,MOJOSHADER_astExpression *looptest,
                 MOJOSHADER_astExpression *counter,MOJOSHADER_astStatement *statement)

{
  MOJOSHADER_astStatement *pMVar1;
  
  pMVar1 = (MOJOSHADER_astStatement *)(*ctx->malloc)(0x50,ctx->malloc_data);
  if (pMVar1 == (MOJOSHADER_astStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar1 = (MOJOSHADER_astStatement *)0x0;
  }
  else {
    (pMVar1->ast).type = MOJOSHADER_AST_STATEMENT_FOR;
    (pMVar1->ast).filename = ctx->sourcefile;
    (pMVar1->ast).line = ctx->sourceline;
    pMVar1->next = (MOJOSHADER_astStatement *)0x0;
    pMVar1[1].ast.type = ~MOJOSHADER_AST_OP_START_RANGE;
    pMVar1[1].ast.filename = (char *)decl;
    *(MOJOSHADER_astExpression **)&pMVar1[1].ast.line = initializer;
    pMVar1[1].next = (MOJOSHADER_astStatement *)looptest;
    *(MOJOSHADER_astExpression **)&pMVar1[2].ast = counter;
    pMVar1[2].ast.filename = (char *)statement;
  }
  return pMVar1;
}

Assistant:

static MOJOSHADER_astStatement *new_for_statement(Context *ctx,
                                    MOJOSHADER_astVariableDeclaration *decl,
                                    MOJOSHADER_astExpression *initializer,
                                    MOJOSHADER_astExpression *looptest,
                                    MOJOSHADER_astExpression *counter,
                                    MOJOSHADER_astStatement *statement)
{
    NEW_AST_NODE(retval, MOJOSHADER_astForStatement,
                 MOJOSHADER_AST_STATEMENT_FOR);
    retval->next = NULL;
    retval->unroll = -1;
    retval->var_decl = decl;
    retval->initializer = initializer;
    retval->looptest = looptest;
    retval->counter = counter;
    retval->statement = statement;
    return (MOJOSHADER_astStatement *) retval;
}